

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbsessionmanager.cpp
# Opt level: O1

void sm_performSaveYourself(QXcbSessionManager *sm)

{
  char *pcVar1;
  char16_t *array;
  int *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  qsizetype qVar5;
  QArrayData *pQVar6;
  QString *pQVar7;
  byte bVar8;
  char cVar9;
  __uid_t _Var10;
  int iVar11;
  Data *pDVar12;
  Data *pDVar13;
  storage_type *psVar14;
  storage_type *psVar15;
  size_t allocSize;
  long in_FS_OFFSET;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  int value;
  QFileInfo fi;
  passwd entry;
  passwd *entryPtr;
  QVarLengthArray<char,_1024LL> buf;
  undefined1 local_5cc [4];
  QArrayData *local_5c8;
  char16_t *pcStack_5c0;
  qsizetype local_5b8;
  QArrayDataPointer<QString> local_5a8;
  QArrayDataPointer<QString> local_588;
  QArrayDataPointer<QString> local_568;
  undefined1 local_548 [16];
  undefined8 local_538;
  char *pcStack_530;
  char *local_528;
  char *pcStack_520;
  passwd *local_510;
  QString local_508;
  QArrayDataPointer<QString> local_4e8;
  timeval local_4c8;
  undefined1 local_4b8 [32];
  QArrayData *local_498;
  char16_t *pcStack_490;
  qsizetype local_488;
  QArrayData *local_478;
  QString *pQStack_470;
  qsizetype local_468;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> local_458 [18];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sm_isshutdown) {
    qt_sm_blockUserInput = true;
  }
  local_4c8.tv_sec = (__time_t)&DAT_aaaaaaaaaaaaaaaa;
  local_4c8.tv_usec = (__suseconds_t)&DAT_aaaaaaaaaaaaaaaa;
  gettimeofday(&local_4c8,(__timezone_ptr_t)0x0);
  QString::number((ulonglong)local_548,(int)local_4c8.tv_sec);
  qVar5 = (qsizetype)local_538;
  uVar4 = local_548._8_8_;
  uVar3 = local_548._0_8_;
  local_538._0_4_ = 0;
  local_538._4_4_ = 0;
  local_548._0_8_ = (QArrayData *)0x0;
  local_548._8_8_ = (char *)0x0;
  QString::number((ulonglong)&local_4e8,(int)local_4c8.tv_usec);
  local_458[0].b.d.size = local_4e8.size;
  local_458[0].b.d.ptr = (char16_t *)local_4e8.ptr;
  local_458[0].b.d.d = (Data *)local_4e8.d;
  local_458[0].a.a.d.d = (Data *)uVar3;
  local_458[0].a.a.d.ptr = (char16_t *)uVar4;
  local_458[0].a.a.d.size = qVar5;
  local_458[0].a.b = L'_';
  local_4e8.d = (Data *)0x0;
  local_4e8.ptr = (QString *)0x0;
  local_4e8.size = 0;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::convertTo<QString>
            ((QString *)local_4b8,local_458);
  QString::operator=((QString *)&sm->field_0x20,(QString *)local_4b8);
  if ((QArrayData *)local_4b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_4b8._0_8_,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder(local_458);
  if (&(local_4e8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_4e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_4e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_4e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_4e8.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_548._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_548._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_548._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_548._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_548._0_8_,2,0x10);
    }
  }
  local_4e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_4e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_4e8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QCoreApplication::arguments();
  local_508.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_508.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_508.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if ((undefined1 *)local_4e8.size == (undefined1 *)0x0) {
    QCoreApplication::applicationFilePath();
  }
  else {
    local_508.d.d = ((local_4e8.ptr)->d).d;
    local_508.d.ptr = ((local_4e8.ptr)->d).ptr;
    local_508.d.size = ((local_4e8.ptr)->d).size;
    if (&(local_508.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_508.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_508.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QVar16.m_data = (storage_type *)0x7;
  QVar16.m_size = (qsizetype)local_458;
  QString::fromLatin1(QVar16);
  sm_setProperty((QString *)local_458,&local_508);
  if (&(local_458[0].a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_458[0].a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_458[0].a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_458[0].a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_458[0].a.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_510 = (passwd *)0x0;
  memset(local_458,0xaa,0x418);
  pDVar12 = (Data *)sysconf(0x46);
  local_458[0].a.a.d.d = (Data *)0x400;
  local_458[0].a.a.d.ptr = (char16_t *)0x0;
  array = &local_458[0].a.b;
  local_458[0].a.a.d.size = (qsizetype)array;
  if ((long)pDVar12 < 0x401) {
    pDVar12 = (Data *)0x400;
  }
  else {
    local_458[0].a.a.d.d = pDVar12;
    pDVar13 = (Data *)QtPrivate::expectedAllocSize((ulong)pDVar12,0x10);
    if (pDVar13 == (Data *)0x0) {
      pDVar13 = pDVar12;
    }
    local_458[0].a.a.d.size = (qsizetype)malloc((size_t)pDVar13);
    local_458[0].a.a.d.d = pDVar13;
  }
  local_528 = &DAT_aaaaaaaaaaaaaaaa;
  pcStack_520 = &DAT_aaaaaaaaaaaaaaaa;
  local_538 = &DAT_aaaaaaaaaaaaaaaa;
  pcStack_530 = &DAT_aaaaaaaaaaaaaaaa;
  local_548._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_548._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_458[0].a.a.d.ptr = (char16_t *)pDVar12;
  _Var10 = geteuid();
  iVar11 = getpwuid_r(_Var10,(passwd *)local_548,(char *)local_458[0].a.a.d.size,
                      (size_t)local_458[0].a.a.d.ptr,&local_510);
  if (iVar11 == 0x22) {
    do {
      if (0x7fff < (long)local_458[0].a.a.d.ptr) {
        local_548._0_8_ = sm_performSaveYourself::badusername;
        local_510 = (passwd *)local_548;
        break;
      }
      pDVar12 = (Data *)((long)local_458[0].a.a.d.ptr * 2);
      pDVar13 = local_458[0].a.a.d.d;
      if (local_458[0].a.a.d.d == pDVar12 ||
          SBORROW8((long)local_458[0].a.a.d.d,(long)pDVar12) !=
          (long)local_458[0].a.a.d.d + (long)local_458[0].a.a.d.ptr * -2 < 0) {
        pDVar13 = pDVar12;
      }
      QVLABase<char>::reallocate_impl
                ((QVLABase<char> *)local_458,0x400,array,(qsizetype)pDVar12,(qsizetype)pDVar13);
      local_458[0].a.a.d.ptr = (char16_t *)pDVar12;
      _Var10 = geteuid();
      iVar11 = getpwuid_r(_Var10,(passwd *)local_548,(char *)local_458[0].a.a.d.size,
                          (size_t)local_458[0].a.a.d.ptr,&local_510);
    } while (iVar11 == 0x22);
  }
  if (local_510 != (passwd *)0x0) {
    QVar17.m_data = &DAT_00000006;
    QVar17.m_size = (qsizetype)local_4b8;
    QString::fromLatin1(QVar17);
    if (local_510->pw_name == (char *)0x0) {
      psVar15 = (storage_type *)0x0;
    }
    else {
      psVar14 = (storage_type *)0xffffffffffffffff;
      do {
        psVar15 = psVar14 + 1;
        pcVar1 = psVar14 + (long)(local_510->pw_name + 1);
        psVar14 = psVar15;
      } while (*pcVar1 != '\0');
    }
    QVar18.m_data = psVar15;
    QVar18.m_size = (qsizetype)&local_568;
    QString::fromLocal8Bit(QVar18);
    sm_setProperty((QString *)local_4b8,(QString *)&local_568);
    if (&(local_568.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_568.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_568.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_568.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_568.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_4b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_4b8._0_8_,2,0x10);
      }
    }
  }
  local_568.d = (Data *)0x0;
  local_568.ptr = (QString *)0x0;
  local_568.size = 0;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)&local_568,0,&local_508);
  QList<QString>::end((QList<QString> *)&local_568);
  QVar19.m_data = (storage_type *)0x8;
  QVar19.m_size = (qsizetype)local_4b8;
  QString::fromLatin1(QVar19);
  local_588.d = (Data *)local_4b8._0_8_;
  local_588.ptr = (QString *)local_4b8._8_8_;
  local_588.size = local_4b8._16_8_;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_568,local_568.size,(QString *)&local_588);
  QList<QString>::end((QList<QString> *)&local_568);
  (**(code **)(*(long *)sm + 0x10))(&local_478,sm);
  qVar5 = local_468;
  pQVar7 = pQStack_470;
  pQVar6 = local_478;
  local_468 = 0;
  local_478 = (QArrayData *)0x0;
  pQStack_470 = (QString *)0x0;
  (**(code **)(*(long *)sm + 0x18))(&local_5c8,sm);
  local_488 = local_5b8;
  pcStack_490 = pcStack_5c0;
  local_498 = local_5c8;
  local_4b8._0_8_ = pQVar6;
  local_4b8._8_8_ = pQVar7;
  local_4b8._16_8_ = qVar5;
  local_4b8._24_2_ = 0x5f;
  local_5c8 = (QArrayData *)0x0;
  pcStack_5c0 = (char16_t *)0x0;
  local_5b8 = 0;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::convertTo<QString>
            ((QString *)&local_5a8,
             (QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)local_4b8);
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_568,local_568.size,(QString *)&local_5a8);
  QList<QString>::end((QList<QString> *)&local_568);
  piVar2 = (int *)CONCAT44(local_5a8.d._4_4_,local_5a8.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_5a8.d._4_4_,local_5a8.d._0_4_),2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)local_4b8);
  if (local_5c8 != (QArrayData *)0x0) {
    LOCK();
    (local_5c8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_5c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_5c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_5c8,2,0x10);
    }
  }
  if (local_478 != (QArrayData *)0x0) {
    LOCK();
    (local_478->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_478->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_478->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_478,2,0x10);
    }
  }
  if (&(local_588.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_588.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_588.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_588.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_588.d)->super_QArrayData,2,0x10);
    }
  }
  local_5c8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  QCoreApplication::applicationFilePath();
  QFileInfo::QFileInfo((QFileInfo *)&local_5c8,(QString *)local_4b8);
  if ((QArrayData *)local_4b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_4b8._0_8_,2,0x10);
    }
  }
  qAppName();
  QFileInfo::fileName();
  iVar11 = QString::compare((QString *)local_4b8,(CaseSensitivity)&local_588);
  if (&(local_588.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_588.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_588.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_588.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_588.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_4b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_4b8._0_8_,2,0x10);
    }
  }
  if (iVar11 != 0) {
    QVar20.m_data = (storage_type *)0x5;
    QVar20.m_size = (qsizetype)local_4b8;
    QString::fromLatin1(QVar20);
    local_588.d = (Data *)local_4b8._0_8_;
    local_588.ptr = (QString *)local_4b8._8_8_;
    local_588.size = local_4b8._16_8_;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_568,local_568.size,(QString *)&local_588);
    QList<QString>::end((QList<QString> *)&local_568);
    qAppName();
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_568,local_568.size,(QString *)local_4b8);
    QList<QString>::end((QList<QString> *)&local_568);
    if ((QArrayData *)local_4b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_4b8._0_8_,2,0x10);
      }
    }
    if (&(local_588.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_588.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_588.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_588.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_588.d)->super_QArrayData,2,0x10);
      }
    }
  }
  (**(code **)(*(long *)sm + 0x50))(sm,&local_568);
  local_588.d = (Data *)0x0;
  local_588.ptr = (QString *)0x0;
  local_588.size = 0;
  (**(code **)(*(long *)sm + 0x60))(sm);
  if (sm_saveType == 0) {
    QPlatformSessionManager::appCommitData();
  }
  else if ((sm_saveType == 1) ||
          ((sm_saveType == 2 &&
           ((QPlatformSessionManager::appCommitData(), sm_isshutdown != true || (sm_cancel == 0)))))
          ) {
    QPlatformSessionManager::appSaveState();
  }
  if ((sm_phase2 == '\x01') && (sm_in_phase2 == '\0')) {
    SmcRequestSaveYourselfPhase2(smcConnection,sm_saveYourselfPhase2Callback,sm);
    qt_sm_blockUserInput = false;
    goto LAB_00184d52;
  }
  if (sm_interactionActive == '\x01') {
    bVar8 = sm_cancel & sm_isshutdown;
LAB_00184b8d:
    SmcInteractDone(smcConnection,bVar8);
    sm_interactionActive = '\0';
  }
  else if (((sm_cancel == 1) && (sm_isshutdown == true)) &&
          (cVar9 = (**(code **)(*(long *)sm + 0x28))(sm), cVar9 != '\0')) {
    bVar8 = 1;
    goto LAB_00184b8d;
  }
  QVar21.m_data = (storage_type *)0xe;
  QVar21.m_size = (qsizetype)local_4b8;
  QString::fromLatin1(QVar21);
  (**(code **)(*(long *)sm + 0x58))(&local_5a8,sm);
  sm_setProperty((QString *)local_4b8,(QStringList *)&local_5a8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_5a8);
  if ((QArrayData *)local_4b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_4b8._0_8_,2,0x10);
    }
  }
  QVar22.m_data = (storage_type *)0xe;
  QVar22.m_size = (qsizetype)local_4b8;
  QString::fromLatin1(QVar22);
  (**(code **)(*(long *)sm + 0x68))(&local_5a8,sm);
  sm_setProperty((QString *)local_4b8,(QStringList *)&local_5a8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_5a8);
  if ((QArrayData *)local_4b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_4b8._0_8_,2,0x10);
    }
  }
  local_5a8.d._4_4_ = 0xaaaaaaaa;
  local_5a8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_5a8.d._0_4_ = 4;
  local_5cc = (undefined1  [4])(**(code **)(*(long *)sm + 0x48))(sm);
  local_5a8.ptr = (QString *)local_5cc;
  local_4b8._0_8_ = "RestartStyleHint";
  local_4b8._8_8_ = "CARD8";
  local_4b8._16_8_ = -0x55555555ffffffff;
  local_4b8._24_8_ = &local_5a8;
  local_478 = (QArrayData *)local_4b8;
  SmcSetProperties(smcConnection,1);
  SmcSaveYourselfDone(smcConnection,sm_cancel ^ 1);
LAB_00184d52:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_588);
  QFileInfo::~QFileInfo((QFileInfo *)&local_5c8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_568);
  if ((char16_t *)local_458[0].a.a.d.size != &local_458[0].a.b) {
    QtPrivate::sizedFree((void *)local_458[0].a.a.d.size,(ulong)local_458[0].a.a.d.d);
  }
  if (&(local_508.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_508.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_508.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_508.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_508.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_4e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void sm_performSaveYourself(QXcbSessionManager *sm)
{
    if (sm_isshutdown)
        qt_sm_blockUserInput = true;

    // generate a new session key
    timeval tv;
    gettimeofday(&tv, nullptr);
    sm->setSessionKey(QString::number(qulonglong(tv.tv_sec)) +
                      u'_' +
                      QString::number(qulonglong(tv.tv_usec)));

    QStringList arguments = QCoreApplication::arguments();
    QString argument0 = arguments.isEmpty() ? QCoreApplication::applicationFilePath()
                                            : arguments.at(0);

    // tell the session manager about our program in best POSIX style
    sm_setProperty(QString::fromLatin1(SmProgram), argument0);
    // tell the session manager about our user as well.
    struct passwd *entryPtr = nullptr;
#if defined(_POSIX_THREAD_SAFE_FUNCTIONS) && (_POSIX_THREAD_SAFE_FUNCTIONS - 0 > 0)
    QVarLengthArray<char, 1024> buf(qMax<long>(sysconf(_SC_GETPW_R_SIZE_MAX), 1024L));
    struct passwd entry;
    while (getpwuid_r(geteuid(), &entry, buf.data(), buf.size(), &entryPtr) == ERANGE) {
        if (buf.size() >= 32768) {
            // too big already, fail
            static char badusername[] = "";
            entryPtr = &entry;
            entry.pw_name = badusername;
            break;
        }

        // retry with a bigger buffer
        buf.resize(buf.size() * 2);
    }
#else
    entryPtr = getpwuid(geteuid());
#endif
    if (entryPtr)
        sm_setProperty(QString::fromLatin1(SmUserID), QString::fromLocal8Bit(entryPtr->pw_name));

    // generate a restart and discard command that makes sense
    QStringList restart;
    restart << argument0 << "-session"_L1 << sm->sessionId() + u'_' + sm->sessionKey();

    QFileInfo fi(QCoreApplication::applicationFilePath());
    if (qAppName().compare(fi.fileName(), Qt::CaseInsensitive) != 0)
        restart << "-name"_L1 << qAppName();
    sm->setRestartCommand(restart);
    QStringList discard;
    sm->setDiscardCommand(discard);

    switch (sm_saveType) {
    case SmSaveBoth:
        sm->appCommitData();
        if (sm_isshutdown && sm_cancel)
            break; // we cancelled the shutdown, no need to save state
    Q_FALLTHROUGH();
    case SmSaveLocal:
        sm->appSaveState();
        break;
    case SmSaveGlobal:
        sm->appCommitData();
        break;
    default:
        break;
    }

    if (sm_phase2 && !sm_in_phase2) {
        SmcRequestSaveYourselfPhase2(smcConnection, sm_saveYourselfPhase2Callback, (SmPointer*) sm);
        qt_sm_blockUserInput = false;
    } else {
        // close eventual interaction monitors and cancel the
        // shutdown, if required. Note that we can only cancel when
        // performing a shutdown, it does not work for checkpoints
        if (sm_interactionActive) {
            SmcInteractDone(smcConnection, sm_isshutdown && sm_cancel);
            sm_interactionActive = false;
        } else if (sm_cancel && sm_isshutdown) {
            if (sm->allowsErrorInteraction()) {
                SmcInteractDone(smcConnection, True);
                sm_interactionActive = false;
            }
        }

        // set restart and discard command in session manager
        sm_setProperty(QString::fromLatin1(SmRestartCommand), sm->restartCommand());
        sm_setProperty(QString::fromLatin1(SmDiscardCommand), sm->discardCommand());

        // set the restart hint
        SmPropValue prop;
        prop.length = sizeof(int);
        int value = sm->restartHint();
        prop.value = (SmPointer) &value;
        sm_setProperty(SmRestartStyleHint, SmCARD8, 1, &prop);

        // we are done
        SmcSaveYourselfDone(smcConnection, !sm_cancel);
    }
}